

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

void __thiscall libcellml::Variable::Variable(Variable *this,string *name)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_type *psVar2;
  NamedEntityImpl *pImpl;
  
  pImpl = (NamedEntityImpl *)operator_new(0x120);
  memset(pImpl,0,0x120);
  (pImpl->super_ParentedEntityImpl).super_EntityImpl.mId._M_dataplus._M_p =
       (pointer)&(pImpl->super_ParentedEntityImpl).super_EntityImpl.mId.field_2;
  (pImpl->super_ParentedEntityImpl).super_EntityImpl.mId._M_string_length = 0;
  (pImpl->super_ParentedEntityImpl).super_EntityImpl.mId.field_2._M_local_buf[0] = '\0';
  (pImpl->super_ParentedEntityImpl).mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pImpl->super_ParentedEntityImpl).mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pImpl->mName)._M_dataplus._M_p = (pointer)&(pImpl->mName).field_2;
  (pImpl->mName)._M_string_length = 0;
  (pImpl->mName).field_2._M_local_buf[0] = '\0';
  p_Var1 = &pImpl[1].super_ParentedEntityImpl.mParent.
            super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(undefined4 *)
   &pImpl[1].super_ParentedEntityImpl.mParent.
    super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 0;
  pImpl[1].mName._M_dataplus._M_p = (pointer)0x0;
  pImpl[1].super_ParentedEntityImpl.super_EntityImpl.mId._M_dataplus._M_p = (pointer)0x0;
  pImpl[1].super_ParentedEntityImpl.super_EntityImpl.mId._M_string_length = 0;
  pImpl[1].super_ParentedEntityImpl.super_EntityImpl.mId.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pImpl[1].super_ParentedEntityImpl.super_EntityImpl.mId.field_2 + 8) = 0;
  pImpl[1].mName._M_string_length = (size_type)p_Var1;
  pImpl[1].mName.field_2._M_allocated_capacity = (size_type)p_Var1;
  *(undefined8 *)((long)&pImpl[1].mName.field_2 + 8) = 0;
  psVar2 = &pImpl[2].super_ParentedEntityImpl.super_EntityImpl.mId._M_string_length;
  *(undefined4 *)&pImpl[2].super_ParentedEntityImpl.super_EntityImpl.mId._M_string_length = 0;
  pImpl[2].super_ParentedEntityImpl.super_EntityImpl.mId.field_2._M_allocated_capacity = 0;
  *(size_type **)((long)&pImpl[2].super_ParentedEntityImpl.super_EntityImpl.mId.field_2 + 8) =
       psVar2;
  pImpl[2].super_ParentedEntityImpl.mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)psVar2;
  pImpl[2].super_ParentedEntityImpl.mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pImpl[2].mName._M_dataplus._M_p = (pointer)&pImpl[2].mName.field_2;
  pImpl[2].mName._M_string_length = 0;
  pImpl[2].mName.field_2._M_local_buf[0] = '\0';
  pImpl[3].super_ParentedEntityImpl.super_EntityImpl.mId._M_dataplus._M_p =
       (pointer)&pImpl[3].super_ParentedEntityImpl.super_EntityImpl.mId.field_2;
  pImpl[3].super_ParentedEntityImpl.super_EntityImpl.mId._M_string_length = 0;
  pImpl[3].super_ParentedEntityImpl.super_EntityImpl.mId.field_2._M_local_buf[0] = '\0';
  pImpl[3].super_ParentedEntityImpl.mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  pImpl[3].super_ParentedEntityImpl.mParent.
  super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  NamedEntity::NamedEntity(&this->super_NamedEntity,pImpl);
  (this->super_enable_shared_from_this<libcellml::Variable>)._M_weak_this.
  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<libcellml::Variable>)._M_weak_this.
  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Variable_002f67c8;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].mId.field_2.
  _M_allocated_capacity = (size_type)this;
  NamedEntity::setName(&this->super_NamedEntity,name);
  return;
}

Assistant:

Variable::Variable(const std::string &name)
    : NamedEntity(new Variable::VariableImpl())
{
    pFunc()->mVariable = this;
    setName(name);
}